

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_DataStructures_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0034e448 == '\x01') {
    DAT_0034e448 = '\0';
    (*(code *)*_StringToInt64Map_default_instance_)();
  }
  if (DAT_0034e4c0 == '\x01') {
    DAT_0034e4c0 = '\0';
    (*(code *)*_Int64ToStringMap_default_instance_)();
  }
  if (DAT_0034e538 == '\x01') {
    DAT_0034e538 = '\0';
    (*(code *)*_StringToDoubleMap_default_instance_)();
  }
  if (DAT_0034e5b0 == '\x01') {
    DAT_0034e5b0 = '\0';
    (*(code *)*_Int64ToDoubleMap_default_instance_)();
  }
  if (DAT_0034e5e8 == '\x01') {
    DAT_0034e5e8 = '\0';
    (*(code *)*_StringVector_default_instance_)();
  }
  if (DAT_0034e618 == '\x01') {
    DAT_0034e618 = '\0';
    (*(code *)*_Int64Vector_default_instance_)();
  }
  if (DAT_0034e648 == '\x01') {
    DAT_0034e648 = '\0';
    (*(code *)*_FloatVector_default_instance_)();
  }
  if (DAT_0034e678 == '\x01') {
    DAT_0034e678 = '\0';
    (*(code *)*_DoubleVector_default_instance_)();
  }
  if (DAT_0034e6a8 == '\x01') {
    DAT_0034e6a8 = '\0';
    (*(code *)*_Int64Range_default_instance_)();
  }
  if (DAT_0034e6d8 == '\x01') {
    DAT_0034e6d8 = '\0';
    (*(code *)*_Int64Set_default_instance_)();
  }
  if (DAT_0034e708 == '\x01') {
    DAT_0034e708 = 0;
    (*(code *)*_DoubleRange_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _StringToInt64Map_default_instance_.Shutdown();
  _Int64ToStringMap_default_instance_.Shutdown();
  _StringToDoubleMap_default_instance_.Shutdown();
  _Int64ToDoubleMap_default_instance_.Shutdown();
  _StringVector_default_instance_.Shutdown();
  _Int64Vector_default_instance_.Shutdown();
  _FloatVector_default_instance_.Shutdown();
  _DoubleVector_default_instance_.Shutdown();
  _Int64Range_default_instance_.Shutdown();
  _Int64Set_default_instance_.Shutdown();
  _DoubleRange_default_instance_.Shutdown();
}